

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibPrepareAdd(Sfm_Lib_t *p,word *pTruth,int *Perm,int nFanins,Mio_Cell2_t *pCellBot,
                      Mio_Cell2_t *pCellTop,int InTop)

{
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar1;
  int *piVar2;
  uint uVar3;
  word wVar4;
  int i;
  int iVar5;
  int iVar6;
  int i_00;
  long lVar7;
  int *piVar8;
  ulong uVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  int Addition;
  int iVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  Sfm_Fun_t *pSVar14;
  int Profile [8];
  int InvPerm [8];
  
  if (pCellTop == (Mio_Cell2_t *)0x0) {
    iVar12 = 0;
  }
  else {
    iVar12 = (int)pCellTop->AreaW;
  }
  wVar4 = pCellBot->AreaW;
  i = Vec_MemHashInsert(p->vTtMem,pTruth);
  p_00 = &p->vLists;
  iVar5 = extraout_EDX;
  if (i == (p->vLists).nSize) {
    Vec_IntPush(p_00,-1);
    Vec_IntPush(&p->vCounts,0);
    Vec_IntPush(&p->vHits,0);
    iVar5 = extraout_EDX_00;
  }
  iVar12 = iVar12 + (int)wVar4;
  if (p->fDelay == 0) {
    iVar5 = Vec_IntEntry(p_00,i);
    if (iVar5 == -1) {
      pSVar14 = (Sfm_Fun_t *)0x0;
      goto LAB_0042a040;
    }
    lVar7 = (long)iVar5;
    do {
      pSVar14 = p->pObjs + lVar7;
LAB_0042a040:
      do {
        if (pSVar14 == (Sfm_Fun_t *)0x0) {
          uVar13 = 0;
          if (0 < nFanins) {
            uVar13 = (ulong)(uint)nFanins;
          }
          goto LAB_0042a07b;
        }
        if (pSVar14->Area <= iVar12) {
          return;
        }
        lVar7 = (long)pSVar14->Next;
        pSVar14 = (Sfm_Fun_t *)0x0;
      } while (lVar7 == -1);
    } while( true );
  }
  if ((p->vProfs).nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(&p->vProfs) == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x15f,
                  "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                 );
  }
  Sfm_LibCellProfile(pCellBot,pCellTop,iVar5,nFanins,Perm,Profile);
  (p->vTemp).nSize = 0;
  iVar5 = Vec_IntEntry(p_00,i);
  if (iVar5 == -1) {
    pSVar14 = (Sfm_Fun_t *)0x0;
  }
  else {
    pSVar14 = p->pObjs + iVar5;
  }
  p_01 = &p->vTemp;
  uVar3 = 0;
  if (0 < nFanins) {
    uVar3 = nFanins;
  }
  uVar13 = (ulong)uVar3;
  while (pSVar14 != (Sfm_Fun_t *)0x0) {
    Vec_IntPush(p_01,(int)(((long)pSVar14 - (long)p->pObjs) / 0x1c));
    iVar5 = Vec_IntEntry(&p->vProfs,(int)(((long)pSVar14 - (long)p->pObjs) / 0x1c));
    piVar8 = Vec_IntEntryP(&p->vStore,iVar5);
    if (pSVar14->Area <= iVar12) {
      uVar9 = 0;
      do {
        if (uVar13 == uVar9) {
          p->nObjSkipped = p->nObjSkipped + 1;
          return;
        }
        piVar2 = Profile + uVar9;
        piVar1 = piVar8 + uVar9;
        uVar9 = uVar9 + 1;
      } while (*piVar1 <= *piVar2);
    }
    piVar8 = &pSVar14->Next;
    pSVar14 = (Sfm_Fun_t *)0x0;
    if ((long)*piVar8 != -1) {
      pSVar14 = p->pObjs + *piVar8;
    }
  }
  iVar5 = 0;
  iVar10 = 0;
  do {
    iVar6 = (p->vTemp).nSize;
    if (iVar6 <= iVar10) {
      if (iVar5 < iVar10) {
        if (iVar5 == 0) {
          Vec_IntWriteEntry(p_00,i,-1);
        }
        else {
          if (iVar6 < iVar5) {
            __assert_fail("p->nSize >= nSizeNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
          }
          (p->vTemp).nSize = iVar5;
          iVar10 = Vec_IntEntry(p_01,0);
          Vec_IntWriteEntry(p_00,i,iVar10);
          for (iVar5 = 1; iVar5 < (p->vTemp).nSize; iVar5 = iVar5 + 1) {
            iVar6 = Vec_IntEntry(p_01,iVar5);
            p->pObjs[iVar10].Next = iVar6;
            iVar10 = iVar6;
          }
          p->pObjs[iVar10].Next = -1;
        }
      }
LAB_0042a07b:
      for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
        InvPerm[Perm[uVar9]] = (int)uVar9;
      }
      if (p->fDelay != 0) {
        Vec_IntPush(&p->vProfs,(p->vStore).nSize);
        for (uVar9 = 0; uVar13 != uVar9; uVar9 = uVar9 + 1) {
          Vec_IntPush(&p->vStore,Profile[uVar9]);
        }
      }
      iVar5 = p->nObjs;
      if (iVar5 == p->nObjsAlloc) {
        iVar10 = iVar5 * 2;
        if (p->pObjs == (Sfm_Fun_t *)0x0) {
          pSVar14 = (Sfm_Fun_t *)malloc((long)iVar5 * 0x38);
          iVar6 = iVar5;
        }
        else {
          pSVar14 = (Sfm_Fun_t *)realloc(p->pObjs,(long)iVar5 * 0x38);
          iVar5 = p->nObjs;
          iVar6 = p->nObjsAlloc;
        }
        p->pObjs = pSVar14;
        memset(pSVar14 + iVar6,0,(long)iVar6 * 0x1c);
        p->nObjsAlloc = iVar10;
      }
      else {
        pSVar14 = p->pObjs;
      }
      pSVar14[iVar5].Area = iVar12;
      iVar12 = Vec_IntEntry(p_00,i);
      pSVar14[iVar5].Next = iVar12;
      iVar12 = p->nObjs;
      p->nObjs = iVar12 + 1;
      Vec_IntWriteEntry(p_00,i,iVar12);
      Vec_IntAddToEntry(&p->vCounts,i,Addition);
      if ((*(uint *)&pCellBot->field_0x10 & 0x3ffff80) != 0) {
        __assert_fail("pCellBot->Id < 128",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                      ,0x1aa,
                      "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                     );
      }
      pSVar14[iVar5].pFansB[0] = (char)*(uint *)&pCellBot->field_0x10;
      for (uVar13 = 0; uVar13 < *(uint *)&pCellBot->field_0x10 >> 0x1c; uVar13 = uVar13 + 1) {
        pSVar14[iVar5].pFansB[uVar13 + 1] = (char)InvPerm[uVar13];
      }
      if (pCellTop != (Mio_Cell2_t *)0x0) {
        if ((*(uint *)&pCellTop->field_0x10 & 0x3ffff80) != 0) {
          __assert_fail("pCellTop->Id < 128",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                        ,0x1b0,
                        "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                       );
        }
        pSVar14[iVar5].pFansT[0] = (char)*(uint *)&pCellTop->field_0x10;
        for (uVar9 = 0; iVar12 = (int)uVar13, uVar9 < *(uint *)&pCellTop->field_0x10 >> 0x1c;
            uVar9 = uVar9 + 1) {
          cVar11 = '\x10';
          if ((uint)InTop != uVar9) {
            uVar13 = (ulong)(iVar12 + 1);
            cVar11 = (char)InvPerm[iVar12];
          }
          pSVar14[iVar5].pFansT[uVar9 + 1] = cVar11;
        }
        if (iVar12 != nFanins) {
          __assert_fail("k == nFanins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                        ,0x1b4,
                        "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                       );
        }
      }
      return;
    }
    iVar6 = Vec_IntEntry(p_01,iVar10);
    i_00 = Vec_IntEntry(&p->vProfs,iVar6);
    piVar8 = Vec_IntEntryP(&p->vStore,i_00);
    if (iVar12 <= p->pObjs[iVar6].Area) {
      uVar9 = 0;
      do {
        if (uVar13 == uVar9) {
          p->nObjRemoved = p->nObjRemoved + 1;
          goto LAB_00429f53;
        }
        piVar2 = Profile + uVar9;
        piVar1 = piVar8 + uVar9;
        uVar9 = uVar9 + 1;
      } while (*piVar2 <= *piVar1);
    }
    Vec_IntWriteEntry(p_01,iVar5,iVar6);
    iVar5 = iVar5 + 1;
LAB_00429f53:
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void Sfm_LibPrepareAdd( Sfm_Lib_t * p, word * pTruth, int * Perm, int nFanins, Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop )
{
    Sfm_Fun_t * pObj;
    int InvPerm[SFM_SUPP_MAX], Profile[SFM_SUPP_MAX];
    int Area = (int)pCellBot->AreaW + (pCellTop ? (int)pCellTop->AreaW : 0);
    int i, k, Id, Prev, Offset, * pProf, iFunc = Vec_MemHashInsert( p->vTtMem, pTruth );
    if ( iFunc == Vec_IntSize(&p->vLists) )
    {
        Vec_IntPush( &p->vLists, -1 );
        Vec_IntPush( &p->vCounts, 0 );
        Vec_IntPush( &p->vHits,   0 );
    }
    assert( pCellBot != NULL );
    // iterate through the supergates of this truth table
    if ( p->fDelay )
    {
        assert( Vec_IntSize(&p->vProfs) == p->nObjs );
        Sfm_LibCellProfile( pCellBot, pCellTop, InTop, nFanins, Perm, Profile );
        // check if new one is contained in old ones
        Vec_IntClear( &p->vTemp );
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            Vec_IntPush( &p->vTemp, Sfm_LibFunId(p, pObj) );
            Offset = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( Sfm_LibNewIsContained(pObj, pProf, Area, Profile, nFanins) )
            {
                p->nObjSkipped++;
                return;
            }
        }
        // check if old ones are contained in new one
        k = 0;
        Vec_IntForEachEntry( &p->vTemp, Id, i )
        {
            Offset = Vec_IntEntry( &p->vProfs, Id );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( !Sfm_LibNewContains(Sfm_LibFun(p, Id), pProf, Area, Profile, nFanins) )
                Vec_IntWriteEntry( &p->vTemp, k++, Id );
            else
                p->nObjRemoved++;
        }
        if ( k < i ) // change
        {
            if ( k == 0 )
                Vec_IntWriteEntry( &p->vLists, iFunc, -1 );
            else
            {
                Vec_IntShrink( &p->vTemp, k );
                Prev = Vec_IntEntry(&p->vTemp, 0);
                Vec_IntWriteEntry( &p->vLists, iFunc, Prev );
                Vec_IntForEachEntryStart( &p->vTemp, Id, i, 1 )
                {
                    Sfm_LibFun(p, Prev)->Next = Id;
                    Prev = Id;
                }
                Sfm_LibFun(p, Prev)->Next = -1;
            }
        }
    }
    else
    {
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            if ( Area >= pObj->Area )
                return;
        }
    }
    for ( k = 0; k < nFanins; k++ )
        InvPerm[Perm[k]] = k;
    // create delay profile
    if ( p->fDelay )
    {
        Vec_IntPush( &p->vProfs, Vec_IntSize(&p->vStore) );
        for ( k = 0; k < nFanins; k++ )
            Vec_IntPush( &p->vStore, Profile[k] );
    }
    // create new object
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjsAlloc = 2 * p->nObjsAlloc;
        p->pObjs = ABC_REALLOC( Sfm_Fun_t, p->pObjs, nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Sfm_Fun_t) * p->nObjsAlloc );
        p->nObjsAlloc = nObjsAlloc;
    }
    pObj = p->pObjs + p->nObjs;
    pObj->Area = Area;
    pObj->Next = Vec_IntEntry(&p->vLists, iFunc);
    Vec_IntWriteEntry( &p->vLists, iFunc, p->nObjs++ );
    Vec_IntAddToEntry( &p->vCounts, iFunc, 1 );
    // create gate
    assert( pCellBot->Id < 128 );
    pObj->pFansB[0] = (char)pCellBot->Id;
    for ( k = 0; k < (int)pCellBot->nFanins; k++ )
        pObj->pFansB[k+1] = InvPerm[k];
    if ( pCellTop == NULL )
        return;
    assert( pCellTop->Id < 128 );
    pObj->pFansT[0] = (char)pCellTop->Id;
    for ( i = 0; i < (int)pCellTop->nFanins; i++ )
        pObj->pFansT[i+1] = (char)(i == InTop ? 16 : InvPerm[k++]);
    assert( k == nFanins );
}